

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportSubroutinePortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportSubroutinePortListSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *args_2)

{
  Token importExport;
  ModportSubroutinePortListSyntax *pMVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  ModportSubroutinePortListSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  pMVar1 = (ModportSubroutinePortListSyntax *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  importExport.info = (Info *)args_1;
  importExport._0_8_ = args_2;
  slang::syntax::ModportSubroutinePortListSyntax::ModportSubroutinePortListSyntax
            (in_stack_00000010,in_stack_00000008,importExport,unaff_retaddr);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }